

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

bool DLevelScript::DoCheckActorTexture(int tid,AActor *activator,int string,bool floor)

{
  sector_t *psVar1;
  FTexture *pFVar2;
  AActor *this;
  char *texname;
  FTexture *pFVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double topz;
  FTextureID **local_98;
  bool *local_70;
  F3DFloor *local_48;
  F3DFloor *resffloor;
  sector_t *resultsec;
  FTexture *pFStack_30;
  FTextureID secpic;
  FTexture *tex;
  AActor *actor;
  bool floor_local;
  int string_local;
  AActor *activator_local;
  int tid_local;
  
  this = SingleActorFromTID(tid,activator);
  if (this == (AActor *)0x0) {
    activator_local._7_1_ = false;
  }
  else {
    texname = FBehavior::StaticLookupString(string);
    pFStack_30 = FTextureManager::FindTexture(&TexMan,texname,2,0x23);
    if (pFStack_30 == (FTexture *)0x0) {
      activator_local._7_1_ = false;
    }
    else {
      FTextureID::FTextureID((FTextureID *)((long)&resultsec + 4));
      if (floor) {
        psVar1 = this->Sector;
        dVar4 = AActor::X(this);
        dVar5 = AActor::Y(this);
        dVar6 = AActor::Z(this);
        sector_t::NextLowestFloorAt
                  (psVar1,dVar4,dVar5,dVar6,0,this->MaxStepHeight,(sector_t_conflict **)&resffloor,
                   &local_48);
        if (local_48 == (F3DFloor *)0x0) {
          local_70 = &(resffloor->top).copied;
        }
        else {
          local_70 = (bool *)(local_48->top).texture;
        }
        resultsec._4_4_ = *(int *)local_70;
      }
      else {
        psVar1 = this->Sector;
        dVar4 = AActor::X(this);
        dVar5 = AActor::Y(this);
        dVar6 = AActor::Z(this);
        topz = AActor::Top(this);
        sector_t::NextHighestCeilingAt
                  (psVar1,dVar4,dVar5,dVar6,topz,0,(sector_t_conflict **)&resffloor,&local_48);
        if (local_48 == (F3DFloor *)0x0) {
          local_98 = &resffloor[1].bottom.texture;
        }
        else {
          local_98 = (FTextureID **)(local_48->bottom).texture;
        }
        resultsec._4_4_ = *(int *)local_98;
      }
      pFVar2 = pFStack_30;
      pFVar3 = FTextureManager::operator[](&TexMan,resultsec._4_4_);
      activator_local._7_1_ = pFVar2 == pFVar3;
    }
  }
  return activator_local._7_1_;
}

Assistant:

bool DLevelScript::DoCheckActorTexture(int tid, AActor *activator, int string, bool floor)
{
	AActor *actor = SingleActorFromTID(tid, activator);
	if (actor == NULL)
	{
		return 0;
	}
	FTexture *tex = TexMan.FindTexture(FBehavior::StaticLookupString(string), FTexture::TEX_Flat,
			FTextureManager::TEXMAN_Overridable|FTextureManager::TEXMAN_TryAny|FTextureManager::TEXMAN_DontCreate);

	if (tex == NULL)
	{ // If the texture we want to check against doesn't exist, then
	  // they're obviously not the same.
		return 0;
	}
	FTextureID secpic;
	sector_t *resultsec;
	F3DFloor *resffloor;

	if (floor)
	{
		actor->Sector->NextLowestFloorAt(actor->X(), actor->Y(), actor->Z(), 0, actor->MaxStepHeight, &resultsec, &resffloor);
		secpic = resffloor ? *resffloor->top.texture : resultsec->planes[sector_t::floor].Texture;
	}
	else
	{
		actor->Sector->NextHighestCeilingAt(actor->X(), actor->Y(), actor->Z(), actor->Top(), 0, &resultsec, &resffloor);
		secpic = resffloor ? *resffloor->bottom.texture : resultsec->planes[sector_t::ceiling].Texture;
	}
	return tex == TexMan[secpic];
}